

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnAtomicFence(SharedValidator *this,Location *loc,uint32_t consistency_model)

{
  Result RVar1;
  Opcode local_28;
  uint32_t local_24;
  Location *pLStack_20;
  uint32_t consistency_model_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_24 = consistency_model;
  pLStack_20 = loc;
  loc_local = (Location *)this;
  Opcode::Opcode(&local_28,AtomicFence);
  this_local._4_4_ = CheckInstr(this,local_28,pLStack_20);
  if (local_24 != 0) {
    RVar1 = PrintError(this,pLStack_20,"unexpected atomic.fence consistency model (expected 0): %u",
                       (ulong)local_24);
    Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  }
  RVar1 = TypeChecker::OnAtomicFence(&this->typechecker_,local_24);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnAtomicFence(const Location& loc,
                                      uint32_t consistency_model) {
  Result result = CheckInstr(Opcode::AtomicFence, loc);
  if (consistency_model != 0) {
    result |= PrintError(
        loc, "unexpected atomic.fence consistency model (expected 0): %u",
        consistency_model);
  }
  result |= typechecker_.OnAtomicFence(consistency_model);
  return result;
}